

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O3

int process_ret_type(c2m_ctx_t c2m_ctx,type *ret_type,MIR_type_t *qword_types)

{
  int iVar1;
  MIR_type_t MVar2;
  int n;
  int iVar3;
  int in_ECX;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  n = classify_arg(c2m_ctx,ret_type,qword_types,in_ECX);
  iVar6 = 0;
  if ((n != 0 && (ret_type->mode & ~TM_BASIC) == TM_STRUCT) &&
     (update_last_qword_type(c2m_ctx,ret_type,qword_types,n), iVar6 = n, 0 < n)) {
    lVar4 = 0;
    iVar6 = 0;
    iVar7 = 0;
    iVar5 = 0;
    iVar3 = 0;
    do {
      MVar2 = qword_types[lVar4];
      iVar1 = iVar6 + 1;
      qword_types[iVar6] = MVar2;
      if ((int)MVar2 < 8) {
        if ((int)MVar2 < 4) {
          if ((MVar2 != MIR_T_I8) && (MVar2 != MIR_T_I16)) {
LAB_0019a90b:
            __assert_fail("FALSE",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                          ,0xa6,"int process_ret_type(c2m_ctx_t, struct type *, MIR_type_t *)");
          }
        }
        else if ((MVar2 != MIR_T_I32) && (MVar2 != MIR_T_I64)) goto LAB_0019a90b;
        iVar3 = iVar3 + 1;
        iVar6 = iVar1;
      }
      else if (MVar2 - MIR_T_F < 2) {
        iVar5 = iVar5 + 1;
        iVar6 = iVar1;
      }
      else if (MVar2 == MIR_T_LD) {
        iVar7 = iVar7 + 1;
        iVar6 = iVar1;
      }
      else {
        if (MVar2 != 0x15) goto LAB_0019a90b;
        n = n + -1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < n);
    iVar6 = n;
    if (1 < iVar7) {
      iVar6 = 0;
    }
    if (2 < iVar5) {
      iVar6 = 0;
    }
    if (2 < iVar3) {
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int process_ret_type (c2m_ctx_t c2m_ctx, struct type *ret_type,
                             MIR_type_t qword_types[MAX_QWORDS]) {
  MIR_type_t type;
  int n, n_iregs, n_fregs, n_stregs, curr;
  int n_qwords = classify_arg (c2m_ctx, ret_type, qword_types, FALSE);

  if (ret_type->mode != TM_STRUCT && ret_type->mode != TM_UNION) return 0;
  if (n_qwords != 0) {
    update_last_qword_type (c2m_ctx, ret_type, qword_types, n_qwords);
    n_iregs = n_fregs = n_stregs = curr = 0;
    for (n = 0; n < n_qwords; n++) { /* start from the last qword */
      type = qword_types[n];
      qword_types[curr++] = type;
      switch ((int) type) {
      case MIR_T_I8:
      case MIR_T_I16:
      case MIR_T_I32:
      case MIR_T_I64: n_iregs++; break;
      case MIR_T_F:
      case MIR_T_D: n_fregs++; break;
      case MIR_T_LD: n_stregs++; break;
      case X87UP_CLASS:
        n_qwords--;
        curr--;
        break;
      default: assert (FALSE);
      }
    }
    if (n_iregs > 2 || n_fregs > 2 || n_stregs > 1) n_qwords = 0;
  }
  return n_qwords;
}